

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O0

size_type __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::erase
          (set<Color,_std::less<Color>_> *this,key_type *key)

{
  bool bVar1;
  undefined1 local_30 [7];
  bool res;
  reference ref;
  key_type *key_local;
  set<Color,_std::less<Color>_> *this_local;
  
  ref._16_8_ = key;
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
  operator[]((reference *)local_30,&this->a,*key);
  bVar1 = bitset::reference_impl::operator_cast_to_bool((reference_impl *)local_30);
  if (bVar1) {
    this->s = this->s - 1;
  }
  bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
  reference_impl<magic_enum::containers::bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_*>
  ::operator=((reference_impl<magic_enum::containers::bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_*>
               *)local_30,false);
  return (ulong)bVar1;
}

Assistant:

constexpr size_type erase(const key_type& key) noexcept {
    typename container_type::reference ref = a[key];
    bool res = ref;
    if (res) {
      --s;
    }
    ref = false;
    return res;
  }